

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O1

int __thiscall QPrintPreviewWidgetPrivate::calcCurrentPage(QPrintPreviewWidgetPrivate *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  PageItem *pg;
  long lVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  undefined1 auVar8 [16];
  int local_cc;
  undefined1 local_90 [24];
  QRect local_78;
  QArrayData *local_68;
  long lStack_60;
  long local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_cc = this->curPage;
  local_48.x1.m_i = -0x55555556;
  local_48.y1.m_i = -0x55555556;
  local_48.x2.m_i = -0x55555556;
  local_48.y2.m_i = -0x55555556;
  lVar2 = QAbstractScrollArea::viewport();
  lVar2 = *(long *)(lVar2 + 0x20);
  local_48.x2.m_i = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_48.y2.m_i = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_58 = -0x5555555555555556;
  local_68 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  lStack_60 = -0x5555555555555556;
  QGraphicsView::items((QRect *)&local_68,(ItemSelectionMode)this->graphicsView);
  lVar2 = lStack_60;
  if (local_58 != 0) {
    lVar3 = local_58 << 3;
    lVar6 = 0;
    iVar5 = 0;
    do {
      lVar1 = *(long *)(lVar2 + lVar6);
      QGraphicsItem::sceneBoundingRect();
      QGraphicsView::mapFromScene((QRectF *)local_90);
      QVar7 = (QRect)QPolygon::boundingRect();
      local_78 = QVar7;
      auVar8 = QRect::operator&(&local_78,&local_48);
      if ((QArrayData *)local_90._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_90._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_90._0_8_,8,0x10);
        }
      }
      iVar4 = ((auVar8._12_4_ - auVar8._4_4_) + 1) * ((auVar8._8_4_ - auVar8._0_4_) + 1);
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
        local_cc = *(int *)(lVar1 + 0x10);
      }
      else if ((iVar4 == iVar5) && (iVar4 = *(int *)(lVar1 + 0x10), iVar4 < local_cc)) {
        local_cc = iVar4;
      }
      lVar6 = lVar6 + 8;
    } while (lVar3 != lVar6);
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_cc;
}

Assistant:

int QPrintPreviewWidgetPrivate::calcCurrentPage()
{
    int maxArea = 0;
    int newPage = curPage;
    QRect viewRect = graphicsView->viewport()->rect();
    const QList<QGraphicsItem*> items = graphicsView->items(viewRect);
    for (auto *item : items) {
        PageItem* pg = static_cast<PageItem*>(item);
        QRect overlap = graphicsView->mapFromScene(pg->sceneBoundingRect()).boundingRect() & viewRect;
        int area = overlap.width() * overlap.height();
        if (area > maxArea) {
            maxArea = area;
            newPage = pg->pageNumber();
        } else if (area == maxArea && pg->pageNumber() < newPage) {
            newPage = pg->pageNumber();
        }
    }
    return newPage;
}